

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool replaceAt)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  byte *pbVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  cmValue cVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  long *plVar10;
  cmListFileContext *pcVar11;
  undefined8 *puVar12;
  iterator iVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_04;
  undefined4 extraout_var_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_07;
  size_t sVar14;
  ostream *poVar15;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  uint uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  MessageType MVar20;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  string_view str;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view str_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  string varresult;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string result;
  t_lookup lookup;
  string variable;
  string local_2c8;
  string *local_2a8;
  string local_2a0;
  MessageType local_27c;
  cmMakefile *local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  iterator iStack_260;
  t_lookup *local_258;
  undefined1 *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  undefined1 local_240;
  undefined7 uStack_23f;
  undefined4 local_22c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  string local_220;
  undefined4 local_200;
  undefined4 local_1fc;
  string *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  cmListFileBacktrace *local_1e0;
  RegularExpression *local_1d8;
  cmState *local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  string local_50;
  
  local_200 = CONCAT31(in_register_00000089,atOnly);
  local_1fc = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_22c = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(source->_M_dataplus)._M_p;
  local_250 = &local_240;
  local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  local_240 = 0;
  local_2a8 = errorstr;
  local_1f8 = source;
  std::__cxx11::string::reserve((ulong)&local_250);
  local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  iStack_260._M_current = (t_lookup *)0x0;
  local_258 = (t_lookup *)0x0;
  local_1d0 = (this->GlobalGenerator->CMakeInstance->State)._M_t.
              super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
       ::lineVar_abi_cxx11_ == '\0') &&
     (iVar8 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                   ::lineVar_abi_cxx11_), iVar8 != 0)) {
    ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
    ::lineVar_abi_cxx11_._M_dataplus._M_p =
         (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                   ::lineVar_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                  ::lineVar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                         ::lineVar_abi_cxx11_);
  }
  local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)line;
  local_1d8 = &this->cmNamedCurly;
  iVar13._M_current = (t_lookup *)&this->Backtrace;
  local_27c = LOG;
  local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
  bVar4 = false;
  paVar17 = paVar16;
  local_278 = this;
  local_1e0 = (cmListFileBacktrace *)iVar13._M_current;
  do {
    bVar1 = paVar16->_M_local_buf[0];
    paVar19 = paVar17;
    if (bVar1 < 0x40) {
      if (bVar1 == 0) {
        iVar13._M_current = (t_lookup *)CONCAT71((int7)((ulong)iVar13._M_current >> 8),1);
        local_1f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)iVar13._M_current;
      }
      else if (bVar1 == 10) {
        local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_270 + 1);
      }
      else {
        if (bVar1 != 0x24) goto LAB_002a9be4;
        if ((char)local_200 != '\0') goto LAB_002a923a;
        uVar2 = (ulong)local_220._M_dataplus._M_p >> 0x20;
        local_220._M_dataplus._M_p = (pointer)(uVar2 << 0x20);
        local_220._M_string_length = 0;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar16 + 1);
        bVar1 = *(byte *)((long)paVar16 + 1);
        iVar13._M_current = (t_lookup *)0x0;
        if (bVar1 == 0) {
          iVar13._M_current =
               (t_lookup *)std::__cxx11::string::append((char *)&local_250,(ulong)paVar17);
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        }
        else if (bVar1 == 0x3c) {
LAB_002a9a3a:
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
          paVar19 = paVar17;
        }
        else if (bVar1 == 0x7b) {
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar16 + 2);
          local_220._M_dataplus._M_p = (pointer)(uVar2 << 0x20);
          paVar19 = paVar17;
        }
        else {
          local_1c8._0_8_ = strlen(paVar19->_M_local_buf);
          __str._M_str = "ENV{";
          __str._M_len = 4;
          local_1c8._8_8_ = paVar19;
          iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,4,__str
                            );
          iVar13._M_current = (t_lookup *)CONCAT44(extraout_var_00,iVar8);
          if (iVar8 == 0) {
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar16 + 5);
            local_220._M_dataplus._M_p._0_4_ = 1;
            paVar19 = paVar17;
          }
          else {
            local_1c8._0_8_ = strlen(paVar19->_M_local_buf);
            __str_00._M_str = "CACHE{";
            __str_00._M_len = 6;
            local_1c8._8_8_ = paVar19;
            iVar8 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_1c8,0,6,
                               __str_00);
            iVar13._M_current = (t_lookup *)CONCAT44(extraout_var_01,iVar8);
            if (iVar8 != 0) {
              bVar7 = cmsys::RegularExpression::find
                                (local_1d8,paVar19->_M_local_buf,&local_1d8->regmatch);
              iVar13._M_current = (t_lookup *)CONCAT71(extraout_var,bVar7);
              if (bVar7) {
                local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_2a0,paVar19,
                           (byte *)((long)paVar19 +
                                   ((long)(local_278->cmNamedCurly).regmatch.endp[0] -
                                   (long)(local_278->cmNamedCurly).regmatch.searchstring)));
                plVar10 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_2a0,0,(char *)0x0,0x76d60b);
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 == paVar19) {
                  local_2c8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_2c8.field_2._8_8_ = plVar10[3];
                  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
                }
                else {
                  local_2c8.field_2._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_2c8._M_dataplus._M_p = (pointer)*plVar10;
                }
                local_2c8._M_string_length = plVar10[1];
                *plVar10 = (long)paVar19;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar12 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 == paVar19) {
                  local_1b8[0]._0_8_ = paVar19->_M_allocated_capacity;
                  local_1b8[0]._8_8_ = puVar12[3];
                  local_1c8._0_8_ = local_1b8;
                }
                else {
                  local_1b8[0]._0_8_ = paVar19->_M_allocated_capacity;
                  local_1c8._0_8_ =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*puVar12;
                }
                local_1c8._8_8_ = puVar12[1];
                *puVar12 = paVar19;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                iVar13._M_current =
                     (t_lookup *)
                     std::__cxx11::string::operator=((string *)local_2a8,(string *)local_1c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._0_8_ != local_1b8) {
                  operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
                  iVar13._M_current = (t_lookup *)extraout_RAX_00;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  local_2c8.field_2._M_allocated_capacity + 1);
                  iVar13._M_current = (t_lookup *)extraout_RAX_01;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                  operator_delete(local_2a0._M_dataplus._M_p,
                                  CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                           local_2a0.field_2._M_local_buf[0]) + 1);
                  iVar13._M_current = (t_lookup *)extraout_RAX_02;
                }
                bVar4 = true;
                local_27c = FATAL_ERROR;
              }
              goto LAB_002a9a3a;
            }
            paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar16 + 7);
            local_220._M_dataplus._M_p._0_4_ = 2;
            paVar19 = paVar17;
          }
        }
        if (paVar21 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::__cxx11::string::append((char *)&local_250,(ulong)paVar19);
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar21[-1]._M_local_buf + 0xf);
          local_220._M_string_length = (size_type)local_248;
          paVar19 = paVar21;
          if (iStack_260._M_current == local_258) {
            std::vector<t_lookup,std::allocator<t_lookup>>::_M_realloc_insert<t_lookup_const&>
                      ((vector<t_lookup,std::allocator<t_lookup>> *)&local_268,iStack_260,
                       (t_lookup *)&local_220);
            iVar13._M_current = (t_lookup *)extraout_RAX_03;
          }
          else {
            *(pointer *)iStack_260._M_current = local_220._M_dataplus._M_p;
            (iStack_260._M_current)->loc = (size_t)local_248;
            iStack_260._M_current = iStack_260._M_current + 1;
            iVar13._M_current = (t_lookup *)local_248;
          }
        }
      }
      goto LAB_002a9c1b;
    }
    if (bVar1 == 0x40) {
      if (replaceAt) {
        pbVar5 = (byte *)((long)paVar16 + 1);
        iVar13._M_current = (t_lookup *)strchr((char *)pbVar5,0x40);
        bVar7 = true;
        if (iVar13._M_current != (t_lookup *)pbVar5 &&
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)iVar13._M_current !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_228 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)iVar13._M_current;
          sVar14 = strspn((char *)pbVar5,
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-");
          iVar13._M_current = (t_lookup *)(pbVar5 + sVar14);
          if (local_228 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)iVar13._M_current) {
            local_1c8._0_8_ = local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,pbVar5,pbVar5 + ~(ulong)paVar16 + (long)local_228);
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
            local_2c8._M_string_length = 0;
            local_2c8.field_2._M_allocated_capacity =
                 local_2c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if (((filename == (char *)0x0) ||
                (local_1c8._8_8_ !=
                 ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                 ::lineVar_abi_cxx11_._M_string_length)) ||
               (((byte *)local_1c8._8_8_ != (byte *)0x0 &&
                (iVar8 = bcmp((void *)local_1c8._0_8_,
                              ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                              ::lineVar_abi_cxx11_._M_dataplus._M_p,local_1c8._8_8_), iVar8 != 0))))
            {
              cVar9 = GetDefinition(local_278,(string *)local_1c8);
              if (cVar9.Value == (string *)0x0) {
                if (local_278->SuppressSideEffects == false) {
                  MaybeWarnUninitialized(local_278,(string *)local_1c8,filename);
                }
              }
              else {
                std::__cxx11::string::_M_assign((string *)&local_2c8);
              }
            }
            else {
              local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)-(long)local_270;
              if (0 < (long)local_270) {
                local_1e8 = local_270;
              }
              uVar18 = 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x9 < local_1e8) {
                paVar16 = local_1e8;
                uVar6 = 4;
                do {
                  uVar18 = uVar6;
                  if (paVar16 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x64) {
                    uVar18 = uVar18 - 2;
                    goto LAB_002a9ab0;
                  }
                  if (paVar16 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x3e8) {
                    uVar18 = uVar18 - 1;
                    goto LAB_002a9ab0;
                  }
                  if (paVar16 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x2710) goto LAB_002a9ab0;
                  bVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x1869f < paVar16;
                  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((ulong)paVar16 / 10000);
                  uVar6 = uVar18 + 4;
                } while (bVar7);
                uVar18 = uVar18 + 1;
              }
LAB_002a9ab0:
              lVar3 = (long)local_270 >> 0x3f;
              local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
              std::__cxx11::string::_M_construct
                        ((ulong)&local_2a0,(char)uVar18 - (char)((long)local_270 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long>
                        (local_2a0._M_dataplus._M_p + -lVar3,uVar18,(unsigned_long)local_1e8);
              std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_2a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                         local_2a0.field_2._M_local_buf[0]) + 1);
              }
            }
            if ((char)local_22c != '\0') {
              str_00._M_str = local_2c8._M_dataplus._M_p;
              str_00._M_len = local_2c8._M_string_length;
              cmEscapeQuotes_abi_cxx11_(&local_2a0,str_00);
              std::__cxx11::string::operator=((string *)&local_2c8,(string *)&local_2a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
                operator_delete(local_2a0._M_dataplus._M_p,
                                CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                         local_2a0.field_2._M_local_buf[0]) + 1);
              }
            }
            std::__cxx11::string::append((char *)&local_250,(ulong)paVar17);
            std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_2c8._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            iVar13._M_current = (t_lookup *)local_1b8;
            if ((t_lookup *)local_1c8._0_8_ != iVar13._M_current) {
              operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
              iVar13._M_current = (t_lookup *)extraout_RAX_04;
            }
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)local_228 + 1);
            bVar7 = false;
            paVar16 = local_228;
          }
        }
        paVar19 = paVar17;
        if (!bVar7) goto LAB_002a9c1b;
      }
LAB_002a9be4:
      iVar13._M_current = (t_lookup *)local_268;
      paVar19 = paVar17;
      if (local_268 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iStack_260._M_current) {
        iVar8 = isalnum((int)(char)bVar1);
        iVar13._M_current = (t_lookup *)CONCAT44(extraout_var_02,iVar8);
        if ((iVar8 == 0) &&
           ((iVar13._M_current = (t_lookup *)(ulong)(bVar1 - 0x2b), 0x34 < bVar1 - 0x2b ||
            ((0x1000000000001dU >> ((ulong)iVar13._M_current & 0x3f) & 1) == 0)))) {
          std::__cxx11::string::append((char *)local_2a8);
          std::__cxx11::string::push_back((char)local_2a8);
          std::__cxx11::string::append((char *)&local_250,(ulong)paVar17);
          std::__cxx11::string::substr((ulong)&local_2a0,(ulong)&local_250);
          plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_2a0,0,(char *)0x0,0x76d6e0);
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 == paVar17) {
            local_2c8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_2c8.field_2._8_8_ = plVar10[3];
            local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          }
          else {
            local_2c8.field_2._M_allocated_capacity = paVar17->_M_allocated_capacity;
            local_2c8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_2c8._M_string_length = plVar10[1];
          *plVar10 = (long)paVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 == paVar17) {
            local_1b8[0]._0_8_ = paVar17->_M_allocated_capacity;
            local_1b8[0]._8_8_ = puVar12[3];
            local_1c8._0_8_ = local_1b8;
          }
          else {
            local_1b8[0]._0_8_ = paVar17->_M_allocated_capacity;
            local_1c8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar12;
          }
          local_1c8._8_8_ = puVar12[1];
          *puVar12 = paVar17;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          iVar13._M_current =
               (t_lookup *)std::__cxx11::string::_M_append((char *)local_2a8,local_1c8._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
            iVar13._M_current = (t_lookup *)extraout_RAX_05;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
            iVar13._M_current = (t_lookup *)extraout_RAX_06;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,
                            CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                     local_2a0.field_2._M_local_buf[0]) + 1);
            iVar13._M_current = (t_lookup *)extraout_RAX_07;
          }
          bVar4 = true;
          local_27c = FATAL_ERROR;
        }
      }
    }
    else if (bVar1 == 0x5c) {
LAB_002a923a:
      if ((char)local_1fc == '\0') {
        bVar1 = *(byte *)((long)paVar16 + 1);
        if (bVar1 < 0x72) {
          if (bVar1 == 0x3b) {
            iVar13._M_current = (t_lookup *)local_268;
            if (local_268 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)iStack_260._M_current) goto LAB_002a9763;
          }
          else if (bVar1 == 0x6e) {
            std::__cxx11::string::append((char *)&local_250,(ulong)paVar17);
            iVar13._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_250);
            goto LAB_002a95e6;
          }
LAB_002a958b:
          iVar8 = isalnum((int)(char)bVar1);
          if ((bVar1 == 0) || (iVar8 != 0)) {
            std::__cxx11::string::append((char *)local_2a8);
            if (bVar1 != 0) {
              std::__cxx11::string::push_back((char)local_2a8);
            }
            bVar4 = true;
            iVar13._M_current = (t_lookup *)std::__cxx11::string::append((char *)local_2a8);
          }
          else {
            iVar13._M_current =
                 (t_lookup *)std::__cxx11::string::append((char *)&local_250,(ulong)paVar17);
            paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar16 + 1);
          }
        }
        else {
          if (bVar1 == 0x72) {
            std::__cxx11::string::append((char *)&local_250,(ulong)paVar17);
            iVar13._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_250);
          }
          else {
            if (bVar1 != 0x74) goto LAB_002a958b;
            std::__cxx11::string::append((char *)&local_250,(ulong)paVar17);
            iVar13._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_250);
          }
LAB_002a95e6:
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar16 + 2);
        }
LAB_002a9763:
        paVar19 = paVar17;
        if (paVar17->_M_local_buf[0] != 0) {
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar16 + 1);
        }
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_002a9be4;
      iVar13._M_current = iStack_260._M_current;
      if (local_268 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)iStack_260._M_current) {
        iVar8 = *(int *)(iStack_260._M_current + -1);
        uVar2 = *(ulong *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(iStack_260._M_current + -1))->_M_local_buf + 8);
        iStack_260._M_current = (t_lookup *)(iStack_260._M_current + -1);
        std::__cxx11::string::append((char *)&local_250,(ulong)paVar17);
        std::__cxx11::string::substr((ulong)&local_2c8,(ulong)&local_250);
        local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
        local_2a0._M_string_length = 0;
        local_2a0.field_2._M_local_buf[0] = '\0';
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        local_220._M_string_length = 0;
        local_220.field_2._M_local_buf[0] = '\0';
        if (iVar8 == 0) {
          if (((filename == (char *)0x0) ||
              (local_2c8._M_string_length !=
               ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
               ::lineVar_abi_cxx11_._M_string_length)) ||
             ((local_2c8._M_string_length != 0 &&
              (iVar8 = bcmp(local_2c8._M_dataplus._M_p,
                            ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                            ::lineVar_abi_cxx11_._M_dataplus._M_p,local_2c8._M_string_length),
              iVar8 != 0)))) {
            cVar9 = GetDefinition(local_278,&local_2c8);
          }
          else {
            pcVar11 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                                (&local_1e0->
                                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>);
            if ((pcVar11->DeferId).
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged == true) {
              local_1b8[0]._8_8_ =
                   (pcVar11->DeferId).
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
              local_1b8[0]._0_8_ =
                   (pcVar11->DeferId).
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_string_length;
              local_1c8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x9;
              local_1c8._8_8_ = "DEFERRED:";
              views._M_len = 2;
              views._M_array = (iterator)local_1c8;
              cmCatViews_abi_cxx11_(&local_50,views);
              std::__cxx11::string::operator=((string *)&local_2a0,(string *)&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              cVar9.Value = (string *)0x0;
            }
            else {
              local_228 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)-(long)local_270;
              if (0 < (long)local_270) {
                local_228 = local_270;
              }
              uVar18 = 1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x9 < local_228) {
                paVar17 = local_228;
                uVar6 = 4;
                do {
                  uVar18 = uVar6;
                  if (paVar17 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x64) {
                    uVar18 = uVar18 - 2;
                    goto LAB_002a9ddd;
                  }
                  if (paVar17 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x3e8) {
                    uVar18 = uVar18 - 1;
                    goto LAB_002a9ddd;
                  }
                  if (paVar17 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x2710) goto LAB_002a9ddd;
                  bVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x1869f < paVar17;
                  paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((ulong)paVar17 / 10000);
                  uVar6 = uVar18 + 4;
                } while (bVar7);
                uVar18 = uVar18 + 1;
              }
LAB_002a9ddd:
              lVar3 = (long)local_270 >> 0x3f;
              local_1c8._0_8_ = local_1b8;
              std::__cxx11::string::_M_construct
                        ((ulong)local_1c8,(char)uVar18 - (char)((long)local_270 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long>
                        ((char *)(local_1c8._0_8_ + -lVar3),uVar18,(unsigned_long)local_228);
              std::__cxx11::string::operator=((string *)&local_2a0,(string *)local_1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._0_8_ != local_1b8) {
                operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
              }
              cVar9.Value = (string *)0x0;
            }
          }
        }
        else if (iVar8 == 1) {
          bVar7 = cmsys::SystemTools::GetEnv(&local_2c8,&local_220);
          cVar9.Value = (string *)0x0;
          if (bVar7) {
            cVar9.Value = &local_220;
          }
        }
        else {
          cVar9.Value = (string *)0x0;
          if (iVar8 == 2) {
            cVar9 = cmState::GetCacheEntryValue(local_1d0,&local_2c8);
          }
        }
        if (cVar9.Value == (string *)0x0) {
          if (local_278->SuppressSideEffects == false) {
            MaybeWarnUninitialized(local_278,&local_2c8,filename);
          }
        }
        else if ((char)local_22c == '\0') {
          std::__cxx11::string::_M_assign((string *)&local_2a0);
        }
        else {
          str._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
          str._M_len = (cVar9.Value)->_M_string_length;
          cmEscapeQuotes_abi_cxx11_((string *)local_1c8,str);
          std::__cxx11::string::operator=((string *)&local_2a0,(string *)local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8[0]._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::replace
                  ((ulong)&local_250,uVar2,(char *)((long)local_248 - uVar2),
                   (ulong)local_2a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,
                          CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                   local_220.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
          operator_delete(local_2a0._M_dataplus._M_p,
                          CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                                   local_2a0.field_2._M_local_buf[0]) + 1);
        }
        iVar13._M_current = (t_lookup *)&local_2c8.field_2;
        if ((t_lookup *)local_2c8._M_dataplus._M_p != iVar13._M_current) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          iVar13._M_current = (t_lookup *)extraout_RAX;
        }
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar16 + 1);
      }
    }
LAB_002a9c1b:
    MVar20 = local_27c;
    if (bVar4) goto LAB_002a9e99;
  } while ((((ulong)local_1f0 & 1) == 0) &&
          (pbVar5 = (byte *)((long)paVar16 + 1),
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)paVar16 + 1), paVar17 = paVar19, *pbVar5 != 0));
  if (local_268 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_260._M_current) {
    bVar4 = true;
    std::__cxx11::string::append((char *)local_2a8);
  }
LAB_002a9e99:
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  ",2);
      sVar14 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,filename,sVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      poVar15 = std::ostream::_M_insert<long>((long)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  ",2);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,(local_1f8->_M_dataplus)._M_p,
                         local_1f8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,(local_2a8->_M_dataplus)._M_p,local_2a8->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_2a8,(string *)&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    MVar20 = FATAL_ERROR;
  }
  else {
    std::__cxx11::string::append((char *)&local_250);
    std::__cxx11::string::_M_assign((string *)local_1f8);
  }
  if (local_268 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_268,(long)local_258 - (long)local_268);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,CONCAT71(uStack_23f,local_240) + 1);
  }
  return MVar20;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  MessageType mtype = MessageType::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          cmValue value = nullptr;
          std::string varresult;
          std::string svalue;
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                cmListFileContext const& top = this->Backtrace.Top();
                if (top.DeferId) {
                  varresult = cmStrCat("DEFERRED:"_s, *top.DeferId);
                } else {
                  varresult = std::to_string(line);
                }
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = cmValue(svalue);
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmEscapeQuotes(*value);
            } else {
              varresult = *value;
            }
          } else if (!this->SuppressSideEffects) {
            this->MaybeWarnUninitialized(lookup, filename);
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = nullptr;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = MessageType::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 +
                  strspn(in + 1,
                         "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);

            std::string varresult;
            if (filename && variable == lineVar) {
              varresult = std::to_string(line);
            } else {
              cmValue def = this->GetDefinition(variable);
              if (def) {
                varresult = *def;
              } else if (!this->SuppressSideEffects) {
                this->MaybeWarnUninitialized(variable, filename);
              }
            }

            if (escapeQuotes) {
              varresult = cmEscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
        // Failed to find a valid @ expansion; treat it as literal.
        CM_FALLTHROUGH;
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = MessageType::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = MessageType::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}